

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDsd.c
# Opt level: O3

Vec_Int_t * Lpk_MergeBoundSets(Vec_Int_t *vSets0,Vec_Int_t *vSets1,int nSizeMax)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *p;
  int *piVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  uint Entry;
  long lVar7;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar3 = (int *)malloc(400);
  p->pArray = piVar3;
  iVar4 = vSets0->nSize;
  if (0 < iVar4) {
    iVar2 = vSets1->nSize;
    lVar7 = 0;
    do {
      if (0 < iVar2) {
        uVar1 = vSets0->pArray[lVar7];
        lVar6 = 0;
        do {
          Entry = vSets1->pArray[lVar6] | uVar1;
          if ((((int)Entry >> 0x10 & Entry) == 0) &&
             (uVar5 = (Entry >> 1 & 0x5555) + (Entry & 0x5555),
             uVar5 = (uVar5 >> 2 & 0x3333) + (uVar5 & 0x3333),
             uVar5 = (uVar5 >> 4 & 0x707) + (uVar5 & 0x707),
             (int)((uVar5 >> 8) + (uVar5 & 0xff)) <= nSizeMax)) {
            Vec_IntPush(p,Entry);
            iVar2 = vSets1->nSize;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < iVar2);
        iVar4 = vSets0->nSize;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar4);
  }
  return p;
}

Assistant:

Vec_Int_t * Lpk_MergeBoundSets( Vec_Int_t * vSets0, Vec_Int_t * vSets1, int nSizeMax )
{
    Vec_Int_t * vSets;
    int Entry0, Entry1, Entry;
    int i, k;
    vSets = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vSets0, Entry0, i )
    Vec_IntForEachEntry( vSets1, Entry1, k )
    {
        Entry = Entry0 | Entry1;
        if ( (Entry & (Entry >> 16)) )
            continue;
        if ( Kit_WordCountOnes(Entry & 0xffff) <= nSizeMax )
            Vec_IntPush( vSets, Entry );
    }
    return vSets;
}